

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O1

int luaO_rawarith(lua_State *L,int op,TValue *p1,TValue *p2,TValue *res)

{
  LuaType LVar1;
  int iVar2;
  lua_Integer lVar3;
  lua_Integer v1;
  TValue *io;
  lua_Number lVar4;
  lua_Number v2;
  lua_Integer i2;
  lua_Integer i1;
  lua_Integer local_38;
  lua_Integer local_30;
  
  if ((uint)op < 0xe) {
    if ((0x2f80U >> (op & 0x1fU) & 1) != 0) {
      if (p1->tt_ == 0x13) {
        local_30 = (p1->value_).i;
      }
      else {
        iVar2 = luaV_tointegerns(p1,&local_30,F2Ieq);
        if (iVar2 == 0) {
          return 0;
        }
      }
      if (p2->tt_ == 0x13) {
        local_38 = (p2->value_).i;
        lVar3 = local_38;
        v1 = local_30;
      }
      else {
        iVar2 = luaV_tointegerns(p2,&local_38,F2Ieq);
        lVar3 = local_38;
        v1 = local_30;
        if (iVar2 == 0) {
          return 0;
        }
      }
      goto LAB_00131d4f;
    }
    if ((0x30U >> (op & 0x1fU) & 1) == 0) goto LAB_00131d64;
    LVar1 = p1->tt_;
LAB_00131d23:
    if (LVar1 == 0x13) {
      lVar4 = (lua_Number)(p1->value_).i;
      goto LAB_00131d90;
    }
    if (LVar1 != 3) {
      return 0;
    }
  }
  else {
LAB_00131d64:
    if (p1->tt_ != 3) {
      if (p1->tt_ != 0x13) {
        return 0;
      }
      LVar1 = 0x13;
      if (p2->tt_ == 0x13) {
        lVar3 = (p2->value_).i;
        v1 = (p1->value_).i;
LAB_00131d4f:
        lVar3 = intarith(L,op,v1,lVar3);
        (res->value_).i = lVar3;
        res->tt_ = 0x13;
        return 1;
      }
      goto LAB_00131d23;
    }
  }
  lVar4 = (p1->value_).n;
LAB_00131d90:
  if (p2->tt_ == 0x13) {
    v2 = (lua_Number)(p2->value_).i;
  }
  else {
    if (p2->tt_ != 3) {
      return 0;
    }
    v2 = (p2->value_).n;
  }
  lVar4 = numarith(L,op,lVar4,v2);
  (res->value_).n = lVar4;
  res->tt_ = 3;
  return 1;
}

Assistant:

int luaO_rawarith (lua_State *L, int op, const TValue *p1, const TValue *p2,
                   TValue *res) {
  switch (op) {
    case LUA_OPBAND: case LUA_OPBOR: case LUA_OPBXOR:
    case LUA_OPSHL: case LUA_OPSHR:
    case LUA_OPBNOT: {  /* operate only on integers */
      lua_Integer i1; lua_Integer i2;
      if (tointegerns(p1, &i1) && tointegerns(p2, &i2)) {
        setivalue(res, intarith(L, op, i1, i2));
        return 1;
      }
      else return 0;  /* fail */
    }
    case LUA_OPDIV: case LUA_OPPOW: {  /* operate only on floats */
      lua_Number n1; lua_Number n2;
      if (tonumberns(p1, n1) && tonumberns(p2, n2)) {
        setfltvalue(res, numarith(L, op, n1, n2));
        return 1;
      }
      else return 0;  /* fail */
    }
    default: {  /* other operations */
      lua_Number n1; lua_Number n2;
      if (ttisinteger(p1) && ttisinteger(p2)) {
        setivalue(res, intarith(L, op, ivalue(p1), ivalue(p2)));
        return 1;
      }
      else if (tonumberns(p1, n1) && tonumberns(p2, n2)) {
        setfltvalue(res, numarith(L, op, n1, n2));
        return 1;
      }
      else return 0;  /* fail */
    }
  }
}